

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

int lws_mqtt_client_send_unsubcribe(lws *wsi,lws_mqtt_subscribe_param_t *unsub)

{
  undefined1 *puVar1;
  uchar *buf;
  undefined2 uVar2;
  uchar *puVar3;
  _lws_mqtt_related *p_Var4;
  char *__s;
  int iVar5;
  uint uVar6;
  lws *wsi_00;
  lws_mqtt_subs_t *plVar7;
  size_t sVar8;
  uint16_t u;
  byte bVar9;
  uint8_t *puVar10;
  uint value;
  long lVar11;
  ulong uVar12;
  int local_60;
  uint8_t send_unsub [8];
  lws_mqtt_str_t mqtt_vh_payload;
  
  puVar3 = wsi->context->pt[wsi->tsi].serv_buf;
  wsi_00 = lws_get_network_wsi(wsi);
  _lws_log(8,"%s: Enter\n","lws_mqtt_client_send_unsubcribe");
  uVar6 = 1;
  if ((short)wsi->wsistate == 0x119) {
    send_unsub[0] = '\0';
    send_unsub[1] = '\0';
    send_unsub[2] = '\0';
    send_unsub[3] = '\0';
    send_unsub[4] = '\0';
    send_unsub[5] = '\0';
    send_unsub[6] = '\0';
    send_unsub[7] = '\0';
    buf = puVar3 + 0x10;
    bVar9 = 0;
    lVar11 = 0;
    for (uVar12 = 0; uVar12 < unsub->num_topics; uVar12 = uVar12 + 1) {
      plVar7 = lws_mqtt_find_sub(wsi_00->mqtt,*(char **)((long)&unsub->topic->name + lVar11));
      if (plVar7 == (lws_mqtt_subs_t *)0x0) {
        __assert_fail("mysub",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                      ,0x79c,
                      "int lws_mqtt_client_send_unsubcribe(struct lws *, const lws_mqtt_subscribe_param_t *)"
                     );
      }
      puVar10 = &plVar7->ref_count;
      *puVar10 = *puVar10 + 0xff;
      if (*puVar10 == '\0') {
        _lws_log(4,"%s: Need to send UNSUB\n","lws_mqtt_client_send_unsubcribe");
        send_unsub[uVar12] = '\x01';
        bVar9 = bVar9 + 1;
      }
      lVar11 = lVar11 + 0x10;
    }
    if (bVar9 == 0) {
      _lws_log(4,"%s: unsubscribed!\n","lws_mqtt_client_send_unsubcribe");
      uVar6 = user_callback_handle_rxflow
                        (wsi->protocol->callback,wsi,LWS_CALLBACK_MQTT_UNSUBSCRIBED,wsi->user_space,
                         (void *)0x0,0);
      uVar6 = uVar6 >> 0x1f;
    }
    else {
      *buf = 0xa2;
      uVar6 = unsub->num_topics;
      value = 2;
      puVar10 = send_unsub;
      for (lVar11 = 0; (ulong)uVar6 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
        if (*puVar10 != '\0') {
          sVar8 = strlen(*(char **)((long)&unsub->topic->name + lVar11));
          value = value + (int)sVar8 + 2;
        }
        puVar10 = puVar10 + 1;
      }
      wsi->mqtt->sub_size = (uint16_t)value;
      _lws_log(0x10,"%s: Number of topics = %d, Remaining len = %d\n",
               "lws_mqtt_client_send_unsubcribe",(ulong)bVar9,(ulong)value);
      iVar5 = lws_mqtt_vbi_encode(value,puVar3 + 0x11);
      local_60 = (int)buf;
      if (((int)(puVar3 + (long)iVar5 + 0x11) - local_60) + value < wsi->context->pt_serv_buf_size)
      {
        lws_mqtt_str_init(&mqtt_vh_payload,puVar3 + (long)iVar5 + 0x11,(uint16_t)value,'\0');
        puVar10 = lws_mqtt_str_next(&mqtt_vh_payload,(uint16_t *)0x0);
        p_Var4 = wsi->mqtt;
        uVar2 = p_Var4->pkt_id;
        u = uVar2 + 1;
        p_Var4->pkt_id = u;
        p_Var4->ack_pkt_id = u;
        lws_ser_wu16be(puVar10,u);
        iVar5 = lws_mqtt_str_advance(&mqtt_vh_payload,2);
        if (iVar5 == 0) {
          puVar10 = lws_mqtt_str_next(&mqtt_vh_payload,(uint16_t *)0x0);
          lVar11 = 0;
          for (uVar12 = 0; uVar12 < unsub->num_topics; uVar12 = uVar12 + 1) {
            _lws_log(8,"%s: topics[%d] = %s\n","lws_mqtt_client_send_unsubcribe",uVar12 & 0xffffffff
                     ,*(undefined8 *)((long)&unsub->topic->name + lVar11));
            if (send_unsub[uVar12] != '\0') {
              sVar8 = strlen(*(char **)((long)&unsub->topic->name + lVar11));
              lws_ser_wu16be(puVar10,(uint16_t)sVar8);
              iVar5 = lws_mqtt_str_advance(&mqtt_vh_payload,2);
              if (iVar5 != 0) goto LAB_0011b632;
              puVar10 = lws_mqtt_str_next(&mqtt_vh_payload,(uint16_t *)0x0);
              __s = *(char **)((long)&unsub->topic->name + lVar11);
              sVar8 = strlen(__s);
              lws_strncpy((char *)puVar10,__s,sVar8 + 1);
              sVar8 = strlen(*(char **)((long)&unsub->topic->name + lVar11));
              iVar5 = lws_mqtt_str_advance(&mqtt_vh_payload,(int)sVar8);
              if (iVar5 != 0) goto LAB_0011b632;
              puVar10 = lws_mqtt_str_next(&mqtt_vh_payload,(uint16_t *)0x0);
            }
            lVar11 = lVar11 + 0x10;
          }
          local_60 = (int)puVar10 - local_60;
          uVar6 = 1;
          iVar5 = lws_write(wsi_00,buf,(long)local_60,LWS_WRITE_BINARY);
          if (iVar5 == local_60) {
            puVar1 = &wsi->mqtt->field_0xfe;
            *puVar1 = *puVar1 | 0x10;
            uVar6 = 0;
          }
        }
        else {
LAB_0011b632:
          uVar6 = 1;
        }
      }
      else {
        uVar6 = 1;
        _lws_log(1,"%s: Payload is too big\n","lws_mqtt_client_send_unsubcribe");
      }
    }
  }
  return uVar6;
}

Assistant:

int
lws_mqtt_client_send_unsubcribe(struct lws *wsi,
				const lws_mqtt_subscribe_param_t *unsub)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *b = (uint8_t *)pt->serv_buf + LWS_PRE, *start = b, *p = start;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	lws_mqtt_str_t mqtt_vh_payload;
	uint8_t send_unsub[8], orphaned;
	uint32_t rem_len, n;
	uint32_t __attribute__((unused)) tops;
	lws_mqtt_subs_t *mysub;

	lwsl_info("%s: Enter\n", __func__);

	switch (lwsi_state(wsi)) {
	case LRS_ESTABLISHED: /* Protocol connection established */
		orphaned = 0;
		memset(&send_unsub, 0, sizeof(send_unsub));
		for (n = 0; n < unsub->num_topics; n++) {
			mysub = lws_mqtt_find_sub(nwsi->mqtt,
						  unsub->topic[n].name);
			assert(mysub);

			if (--mysub->ref_count == 0) {
				lwsl_notice("%s: Need to send UNSUB\n", __func__);
				send_unsub[n] = 1;
				orphaned++;
			}
		}

		if (!orphaned) {
			/*
			 * The nwsi still has other subscribers bound to the
			 * topics.
			 *
			 * So, don't send UNSUB to server, and just fake the
			 * UNSUB ACK event for the guy going away.
			 */
			lwsl_notice("%s: unsubscribed!\n", __func__);
			if (user_callback_handle_rxflow(
				    wsi->protocol->callback,
				    wsi, LWS_CALLBACK_MQTT_UNSUBSCRIBED,
				    wsi->user_space, NULL, 0) < 0) {
				/*
				 * We can't directly close here, because the
				 * caller still has the wsi.  Inform the
				 * caller that we want to close
				 */

				return 1;
			}

			return 0;
		}

		/*
		 * one or more of the topics needs to be unsubscribed
		 * from, so we must go to the server with a filtered
		 * list of the new ones only
		 */

		tops = orphaned;

		if (lws_mqtt_fill_fixed_header(p++, LMQCP_CTOS_UNSUBSCRIBE,
					       0, 0, 0)) {
			lwsl_err("%s: Failed to fill fixed header\n", __func__);
			return 1;
		}

		/*
		 * Pid + (Topic len field + Topic len) x Num of Topics
		 */
		rem_len = 2;
		for (n = 0; n < unsub->num_topics; n++)
			if (send_unsub[n])
				rem_len += (2 + strlen(unsub->topic[n].name));

		wsi->mqtt->sub_size = rem_len;

		lwsl_debug("%s: Number of topics = %d, Remaining len = %d\n",
			   __func__, (int)tops, (int)rem_len);

		p += lws_mqtt_vbi_encode(rem_len, p);

		if ((rem_len + lws_ptr_diff(p, start)) >=
					       wsi->context->pt_serv_buf_size) {
			lwsl_err("%s: Payload is too big\n", __func__);
			return 1;
		}

		/* Init lws_mqtt_str */
		lws_mqtt_str_init(&mqtt_vh_payload, (uint8_t *)p, rem_len, 0);
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		/* Packet ID */
		wsi->mqtt->ack_pkt_id = ++wsi->mqtt->pkt_id;
		lws_ser_wu16be(p, wsi->mqtt->ack_pkt_id);

		if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
			return 1;

		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		for (n = 0; n < unsub->num_topics; n++) {
			lwsl_info("%s: topics[%d] = %s\n", __func__,
				   (int)n, unsub->topic[n].name);

			/*
			 * Subscriber still bound to it, don't UBSUB
			 * from the server
			 */
			if (!send_unsub[n])
				continue;

			/* Topic's Len */
			lws_ser_wu16be(p, strlen(unsub->topic[n].name));
			if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

			/* Topic Name */
			lws_strncpy((char *)p, unsub->topic[n].name,
				    strlen(unsub->topic[n].name) + 1);
			if (lws_mqtt_str_advance(&mqtt_vh_payload,
						 strlen(unsub->topic[n].name)))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
		}
		break;

	default:
		return 1;
	}

	if (lws_write(nwsi, start, lws_ptr_diff(p, start), LWS_WRITE_BINARY) !=
					lws_ptr_diff(p, start))
		return 1;

	wsi->mqtt->inside_unsubscribe = 1;

	return 0;
}